

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void imul_GvEvIv(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  uint *puVar3;
  ushort *puVar4;
  int iVar5;
  UIntPtr UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  UInt8 UVar13;
  ulong uVar14;
  ulong uVar15;
  
  (pMyDisasm->Instruction).Category = 0x10002;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"imul",5);
  iVar5 = (pMyDisasm->Reserved_).OperandSize;
  if (iVar5 < 0x20) {
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    uVar14 = (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    UVar6 = (pMyDisasm->Reserved_).EIP_;
    puVar4 = (ushort *)(UVar6 + uVar14);
    (pMyDisasm->Reserved_).EIP_ = (UIntPtr)puVar4;
    uVar15 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar15 != 0) && (uVar15 < uVar14 + UVar6 + 2)) goto LAB_0010dc48;
    uVar15 = (ulong)*puVar4;
    (pMyDisasm->Instruction).Immediat = uVar15;
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.4X",uVar15);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    (pMyDisasm->Operand3).OpType = 0x8040000;
    (pMyDisasm->Operand3).OpSize = 0x10;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = (iVar5 == 0x40) + 0x67;
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    uVar14 = (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    UVar6 = (pMyDisasm->Reserved_).EIP_;
    puVar3 = (uint *)(UVar6 + uVar14);
    (pMyDisasm->Reserved_).EIP_ = (UIntPtr)puVar3;
    uVar15 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar15 != 0) && (uVar15 < uVar14 + UVar6 + 4)) {
LAB_0010dc48:
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar15 = (ulong)*puVar3;
    (pMyDisasm->Instruction).Immediat = uVar15;
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.8X",uVar15);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 4;
    (pMyDisasm->Operand3).OpType = 0x8040000;
    (pMyDisasm->Operand3).OpSize = 0x20;
  }
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar7 = EFLAGS_TABLE[0x26].SF_;
  UVar8 = EFLAGS_TABLE[0x26].ZF_;
  UVar9 = EFLAGS_TABLE[0x26].AF_;
  UVar10 = EFLAGS_TABLE[0x26].PF_;
  UVar11 = EFLAGS_TABLE[0x26].CF_;
  UVar12 = EFLAGS_TABLE[0x26].TF_;
  UVar13 = EFLAGS_TABLE[0x26].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x26].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar7;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar8;
  (pMyDisasm->Instruction).Flags.AF_ = UVar9;
  (pMyDisasm->Instruction).Flags.PF_ = UVar10;
  (pMyDisasm->Instruction).Flags.CF_ = UVar11;
  (pMyDisasm->Instruction).Flags.TF_ = UVar12;
  (pMyDisasm->Instruction).Flags.IF_ = UVar13;
  UVar7 = EFLAGS_TABLE[0x26].NT_;
  UVar8 = EFLAGS_TABLE[0x26].RF_;
  UVar9 = EFLAGS_TABLE[0x26].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x26].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar7;
  (pMyDisasm->Instruction).Flags.RF_ = UVar8;
  (pMyDisasm->Instruction).Flags.alignment = UVar9;
  return;
}

Assistant:

void __bea_callspec__ imul_GvEvIv(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "imul");
    #endif
    if (GV.OperandSize >= 32) {
      GV.MemDecoration = (GV.OperandSize == 64) ? Arg2qword : Arg2dword;
      GV.ImmediatSize = 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;

      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(4, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt32*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.8X",(Int64) *((UInt32*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=4;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 32;

      FillFlags(pMyDisasm, 38);
    }
    else {
      GV.MemDecoration = Arg2word;
      GV.ImmediatSize = 16;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(2, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt16*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.4X",(Int64) *((UInt16*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=2;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 16;

      FillFlags(pMyDisasm, 38);
    }
}